

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O1

ngx_int_t ngx_walk_tree(ngx_tree_ctx_t *ctx,ngx_str_t *tree)

{
  DIR *__s;
  void *pvVar1;
  DIR *pDVar2;
  u_char *puVar3;
  char cVar4;
  int iVar5;
  ngx_int_t nVar6;
  void *__ptr;
  ngx_int_t nVar7;
  int *piVar8;
  size_t sVar9;
  long lVar10;
  __dev_t _Var11;
  char *pcVar12;
  ngx_err_t err;
  ngx_log_t *pnVar13;
  ngx_uint_t level;
  u_char *puVar14;
  undefined1 local_118 [8];
  ngx_dir_t dir;
  undefined1 local_58 [8];
  ngx_str_t file;
  ulong local_38;
  
  if ((ctx->log->log_level & 0x10) != 0) {
    ngx_log_error_core(8,ctx->log,0,"walk tree \"%V\"",tree);
  }
  nVar6 = ngx_open_dir(tree,(ngx_dir_t *)local_118);
  if (nVar6 == -1) {
    pnVar13 = ctx->log;
    nVar6 = -1;
    if (pnVar13->log_level < 3) {
      return -1;
    }
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    puVar14 = tree->data;
    pcVar12 = "opendir() \"%s\" failed";
    goto LAB_0011ba68;
  }
  pvVar1 = ctx->data;
  if (ctx->alloc == 0) {
    __ptr = (void *)0x0;
LAB_0011b5f7:
    piVar8 = __errno_location();
    *piVar8 = 0;
    nVar6 = ngx_read_dir((ngx_dir_t *)local_118);
    if (nVar6 != -1) {
      local_38 = 0;
      file.data = (u_char *)0x0;
      dir._160_8_ = piVar8;
LAB_0011b637:
      pDVar2 = dir.dir;
      __s = dir.dir + 0x13;
      sVar9 = strlen((char *)__s);
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree name %uz:\"%s\"",sVar9,__s);
      }
      if (sVar9 != 2) {
        if ((sVar9 != 1) || (*__s != (DIR)0x2e)) goto LAB_0011b6b4;
LAB_0011b696:
        *piVar8 = 0;
        lVar10 = ngx_read_dir((ngx_dir_t *)local_118);
        goto joined_r0x0011b6ad;
      }
      if ((*__s == (DIR)0x2e) && (pDVar2[0x14] == (DIR)0x2e)) goto LAB_0011b696;
LAB_0011b6b4:
      local_58 = (undefined1  [8])(tree->len + sVar9 + 1);
      if (local_38 < (ulong)local_58) {
        if (local_38 != 0) {
          free(file.data);
        }
        local_38 = tree->len + sVar9 + 1;
        file.data = (u_char *)ngx_alloc(tree->len + sVar9 + 2,ctx->log);
        if (file.data == (u_char *)0x0) {
          nVar6 = -6;
          file.data = (u_char *)0x0;
          goto LAB_0011ba1b;
        }
      }
      puVar3 = file.data;
      memcpy(file.data,tree->data,tree->len);
      puVar14 = puVar3 + tree->len;
      *puVar14 = '/';
      memcpy(puVar14 + 1,__s,sVar9 + 1);
      file.len = (size_t)puVar3;
      if ((ctx->log->log_level & 0x10) != 0) {
        ngx_log_error_core(8,ctx->log,0,"tree path \"%s\"",file.data);
      }
      piVar8 = (int *)dir._160_8_;
      if (((uint)dir.info.__glibc_reserved[2] >> 8 & 1) == 0) {
        dir.info.__glibc_reserved[2]._0_4_ = (uint)dir.info.__glibc_reserved[2] & 0xfffffe00;
        iVar5 = stat64((char *)file.len,(stat64 *)&dir.de);
        if (iVar5 != -1) goto LAB_0011b79b;
        pnVar13 = ctx->log;
        if (2 < pnVar13->log_level) {
          err = *piVar8;
          level = 3;
          pcVar12 = "stat() \"%s\" failed";
LAB_0011b98c:
          ngx_log_error_core(level,pnVar13,err,pcVar12,file.len);
        }
      }
      else {
LAB_0011b79b:
        cVar4 = (char)(uint)dir.info.__glibc_reserved[2];
        if (cVar4 == '\b') {
LAB_0011b7d4:
          if ((ctx->log->log_level & 0x10) != 0) {
            ngx_log_error_core(8,ctx->log,0,"tree file \"%s\"",file.len);
          }
          ctx->size = dir.info.st_rdev;
          _Var11 = dir.info.st_blksize * 0x200;
          if (dir.info.st_blksize * 0x200 < (long)dir.info.st_rdev) {
            _Var11 = dir.info.st_rdev;
          }
          ctx->fs_size = _Var11;
          ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
          ctx->mtime = dir.info.st_atim.tv_nsec;
          lVar10 = (*ctx->file_handler)(ctx,(ngx_str_t *)local_58);
        }
        else {
          if (cVar4 == '\x04') {
LAB_0011b890:
            if ((ctx->log->log_level & 0x10) != 0) {
              ngx_log_error_core(8,ctx->log,0,"tree enter dir \"%s\"",file.len);
            }
            ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
            ctx->mtime = dir.info.st_atim.tv_nsec;
            nVar6 = (*ctx->pre_tree_handler)(ctx,(ngx_str_t *)local_58);
            if (nVar6 == -5) {
              pnVar13 = ctx->log;
              if ((pnVar13->log_level & 0x10) != 0) {
                level = 8;
                err = 0;
                pcVar12 = "tree skip dir \"%s\"";
                goto LAB_0011b98c;
              }
              goto LAB_0011b993;
            }
            if (nVar6 == -6) goto LAB_0011ba1b;
            nVar7 = ngx_walk_tree(ctx,(ngx_str_t *)local_58);
            nVar6 = -6;
            if (nVar7 == -6) goto LAB_0011ba1b;
            ctx->access = (ulong)((uint)dir.info.st_nlink & 0x1ff);
            ctx->mtime = dir.info.st_atim.tv_nsec;
            nVar7 = (*ctx->post_tree_handler)(ctx,(ngx_str_t *)local_58);
            if (nVar7 == -6) goto LAB_0011ba1b;
            goto LAB_0011b993;
          }
          if (cVar4 == '\0') {
            if (((uint)dir.info.st_nlink & 0xf000) == 0x8000) goto LAB_0011b7d4;
            if (((uint)dir.info.st_nlink & 0xf000) == 0x4000) goto LAB_0011b890;
          }
          if ((ctx->log->log_level & 0x10) != 0) {
            ngx_log_error_core(8,ctx->log,0,"tree special \"%s\"",file.len);
          }
          lVar10 = (*ctx->spec_handler)(ctx,(ngx_str_t *)local_58);
        }
        if (lVar10 == -6) {
          nVar6 = -6;
          goto LAB_0011ba1b;
        }
      }
LAB_0011b993:
      *piVar8 = 0;
      lVar10 = ngx_read_dir((ngx_dir_t *)local_118);
joined_r0x0011b6ad:
      if (lVar10 == -1) goto LAB_0011b9db;
      goto LAB_0011b637;
    }
    file.data = (u_char *)0x0;
    local_38 = 0;
LAB_0011b9db:
    if (*piVar8 == 0) {
      nVar6 = 0;
    }
    else {
      nVar6 = -1;
      if (2 < ctx->log->log_level) {
        ngx_log_error_core(3,ctx->log,*piVar8,"readdir() \"%s\" failed",tree->data);
      }
    }
  }
  else {
    __ptr = ngx_alloc(ctx->alloc,ctx->log);
    nVar6 = -6;
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      nVar7 = (*ctx->init_handler)(__ptr,pvVar1);
      file.data = (u_char *)0x0;
      if (nVar7 != -6) {
        ctx->data = __ptr;
        goto LAB_0011b5f7;
      }
    }
    file.data = (u_char *)0x0;
    local_38 = 0;
  }
LAB_0011ba1b:
  if (local_38 != 0) {
    free(file.data);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
    ctx->data = pvVar1;
  }
  iVar5 = closedir((DIR *)local_118);
  if (iVar5 != -1) {
    return nVar6;
  }
  pnVar13 = ctx->log;
  if (pnVar13->log_level < 3) {
    return nVar6;
  }
  piVar8 = __errno_location();
  iVar5 = *piVar8;
  puVar14 = tree->data;
  pcVar12 = "closedir() \"%s\" failed";
LAB_0011ba68:
  ngx_log_error_core(3,pnVar13,iVar5,pcVar12,puVar14);
  return nVar6;
}

Assistant:

ngx_int_t
ngx_walk_tree(ngx_tree_ctx_t *ctx, ngx_str_t *tree)
{
    void       *data, *prev;
    u_char     *p, *name;
    size_t      len;
    ngx_int_t   rc;
    ngx_err_t   err;
    ngx_str_t   file, buf;
    ngx_dir_t   dir;

    ngx_str_null(&buf);

    ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                   "walk tree \"%V\"", tree);

    if (ngx_open_dir(tree, &dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_open_dir_n " \"%s\" failed", tree->data);
        return NGX_ERROR;
    }

    prev = ctx->data;

    if (ctx->alloc) {
        data = ngx_alloc(ctx->alloc, ctx->log);
        if (data == NULL) {
            goto failed;
        }

        if (ctx->init_handler(data, prev) == NGX_ABORT) {
            goto failed;
        }

        ctx->data = data;

    } else {
        data = NULL;
    }

    for ( ;; ) {

        ngx_set_errno(0);

        if (ngx_read_dir(&dir) == NGX_ERROR) {
            err = ngx_errno;

            if (err == NGX_ENOMOREFILES) {
                rc = NGX_OK;

            } else {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, err,
                              ngx_read_dir_n " \"%s\" failed", tree->data);
                rc = NGX_ERROR;
            }

            goto done;
        }

        len = ngx_de_namelen(&dir);
        name = ngx_de_name(&dir);

        ngx_log_debug2(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                      "tree name %uz:\"%s\"", len, name);

        if (len == 1 && name[0] == '.') {
            continue;
        }

        if (len == 2 && name[0] == '.' && name[1] == '.') {
            continue;
        }

        file.len = tree->len + 1 + len;

        if (file.len + NGX_DIR_MASK_LEN > buf.len) {

            if (buf.len) {
                ngx_free(buf.data);
            }

            buf.len = tree->len + 1 + len + NGX_DIR_MASK_LEN;

            buf.data = ngx_alloc(buf.len + 1, ctx->log);
            if (buf.data == NULL) {
                goto failed;
            }
        }

        p = ngx_cpymem(buf.data, tree->data, tree->len);
        *p++ = '/';
        ngx_memcpy(p, name, len + 1);

        file.data = buf.data;

        ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                       "tree path \"%s\"", file.data);

        if (!dir.valid_info) {
            if (ngx_de_info(file.data, &dir) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                              ngx_de_info_n " \"%s\" failed", file.data);
                continue;
            }
        }

        if (ngx_de_is_file(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree file \"%s\"", file.data);

            ctx->size = ngx_de_size(&dir);
            ctx->fs_size = ngx_de_fs_size(&dir);
            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->file_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else if (ngx_de_is_dir(&dir)) {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree enter dir \"%s\"", file.data);

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            rc = ctx->pre_tree_handler(ctx, &file);

            if (rc == NGX_ABORT) {
                goto failed;
            }

            if (rc == NGX_DECLINED) {
                ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                               "tree skip dir \"%s\"", file.data);
                continue;
            }

            if (ngx_walk_tree(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

            ctx->access = ngx_de_access(&dir);
            ctx->mtime = ngx_de_mtime(&dir);

            if (ctx->post_tree_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }

        } else {

            ngx_log_debug1(NGX_LOG_DEBUG_CORE, ctx->log, 0,
                           "tree special \"%s\"", file.data);

            if (ctx->spec_handler(ctx, &file) == NGX_ABORT) {
                goto failed;
            }
        }
    }

failed:

    rc = NGX_ABORT;

done:

    if (buf.len) {
        ngx_free(buf.data);
    }

    if (data) {
        ngx_free(data);
        ctx->data = prev;
    }

    if (ngx_close_dir(&dir) == NGX_ERROR) {
        ngx_log_error(NGX_LOG_CRIT, ctx->log, ngx_errno,
                      ngx_close_dir_n " \"%s\" failed", tree->data);
    }

    return rc;
}